

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglColorClearCase.cpp
# Opt level: O2

void deqp::egl::finish(EGLint api,ApiFunctions *func)

{
  NotSupportedError *this;
  
  if (api != 0x40) {
    if (api == 2) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,"OpenVG is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglVGRenderUtil.cpp"
                 ,0x4d);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    if (api != 4) {
      if (api == 1) {
        gles1::finish();
        return;
      }
      return;
    }
  }
  gles2::finish(&func->gl);
  return;
}

Assistant:

static void finish (EGLint api, const ApiFunctions& func)
{
	switch (api)
	{
		case EGL_OPENGL_ES_BIT:			gles1::finish();		break;
		case EGL_OPENGL_ES2_BIT:		gles2::finish(func.gl);	break;
		case EGL_OPENGL_ES3_BIT_KHR:	gles2::finish(func.gl);	break;
		case EGL_OPENVG_BIT:			vg::finish();			break;
		default:
			DE_ASSERT(DE_FALSE);
	}
}